

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O3

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::comparePrimitivesExact
          (PrimitiveSetInvariance *this,PerPrimitive *primitivesA,PerPrimitive *primitivesB,
          int numPrimitivesPerPatch)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  PrimitiveSetInvariance *pPVar7;
  ulong uVar8;
  PrimitiveSetInvariance *pPVar9;
  int i;
  int iVar10;
  PrimitiveSetInvariance *pPVar11;
  bool bVar12;
  
  iVar4 = (int)primitivesB;
  if (iVar4 < 1) {
    return true;
  }
  pPVar9 = this + 0x14;
  pPVar7 = this + 0x24;
  pPVar11 = this + 0x34;
  uVar8 = 0;
  bVar12 = false;
  iVar6 = 0;
LAB_0079d2e8:
  iVar10 = 0;
  iVar5 = iVar6;
  do {
    iVar6 = (iVar5 + 1) % iVar4;
    if ((*(float *)(this + uVar8 * 0x40 + 0x10) == primitivesA[iVar5].tessCoord[0].m_data[0]) &&
       (!NAN(*(float *)(this + uVar8 * 0x40 + 0x10)) &&
        !NAN(primitivesA[iVar5].tessCoord[0].m_data[0]))) {
      uVar2 = 0;
      do {
        uVar3 = uVar2;
        if (uVar3 == 3) goto LAB_0079d35e;
        pfVar1 = primitivesA[iVar5].tessCoord[0].m_data + uVar3 + 1;
      } while ((*(float *)(pPVar9 + uVar3 * 4) == *pfVar1) &&
              (uVar2 = uVar3 + 1, !NAN(*(float *)(pPVar9 + uVar3 * 4)) && !NAN(*pfVar1)));
      if (2 < uVar3) {
LAB_0079d35e:
        if ((*(float *)(this + uVar8 * 0x40 + 0x20) == primitivesA[iVar5].tessCoord[1].m_data[0]) &&
           (!NAN(*(float *)(this + uVar8 * 0x40 + 0x20)) &&
            !NAN(primitivesA[iVar5].tessCoord[1].m_data[0]))) {
          uVar2 = 0;
          do {
            uVar3 = uVar2;
            if (uVar3 == 3) goto LAB_0079d39d;
            pfVar1 = primitivesA[iVar5].tessCoord[1].m_data + uVar3 + 1;
          } while ((*(float *)(pPVar7 + uVar3 * 4) == *pfVar1) &&
                  (uVar2 = uVar3 + 1, !NAN(*(float *)(pPVar7 + uVar3 * 4)) && !NAN(*pfVar1)));
          if (2 < uVar3) {
LAB_0079d39d:
            if ((*(float *)(this + uVar8 * 0x40 + 0x30) == primitivesA[iVar5].tessCoord[2].m_data[0]
                ) && (!NAN(*(float *)(this + uVar8 * 0x40 + 0x30)) &&
                      !NAN(primitivesA[iVar5].tessCoord[2].m_data[0]))) {
              uVar2 = 0;
              do {
                uVar3 = uVar2;
                if (uVar3 == 3) goto LAB_0079d3e5;
                pfVar1 = primitivesA[iVar5].tessCoord[2].m_data + uVar3 + 1;
              } while ((*(float *)(pPVar11 + uVar3 * 4) == *pfVar1) &&
                      (uVar2 = uVar3 + 1, !NAN(*(float *)(pPVar11 + uVar3 * 4)) && !NAN(*pfVar1)));
              if (2 < uVar3) break;
            }
          }
        }
      }
    }
    iVar10 = iVar10 + 1;
    iVar5 = iVar6;
    if (iVar10 == iVar4) {
      return bVar12;
    }
  } while( true );
LAB_0079d3e5:
  uVar8 = uVar8 + 1;
  bVar12 = ((ulong)primitivesB & 0xffffffff) <= uVar8;
  pPVar9 = pPVar9 + 0x40;
  pPVar7 = pPVar7 + 0x40;
  pPVar11 = pPVar11 + 0x40;
  if (uVar8 == ((ulong)primitivesB & 0xffffffff)) {
    return true;
  }
  goto LAB_0079d2e8;
}

Assistant:

bool comparePrimitivesExact (const PerPrimitive* const primitivesA, const PerPrimitive* const primitivesB, const int numPrimitivesPerPatch)
{
	int ndxB = 0;
	for (int ndxA = 0; ndxA < numPrimitivesPerPatch; ++ndxA)
	{
		const tcu::Vec4 (&coordsA)[3] = primitivesA[ndxA].tessCoord;
		bool match = false;

		// Actually both sets are usually somewhat sorted, so don't reset ndxB after each match. Instead, continue from the next index.
		for (int i = 0; i < numPrimitivesPerPatch; ++i)
		{
			const tcu::Vec4 (&coordsB)[3] = primitivesB[ndxB].tessCoord;
			ndxB = (ndxB + 1) % numPrimitivesPerPatch;

			if (coordsA[0] == coordsB[0] && coordsA[1] == coordsB[1] && coordsA[2] == coordsB[2])
			{
				match = true;
				break;
			}
		}

		if (!match)
			return false;
	}
	return true;
}